

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhash.h
# Opt level: O1

void mh_assoc_del_resize(mh_assoc_t *h,mh_int_t x,void *arg)

{
  assoc_val **ppaVar1;
  mh_assoc_t *h_00;
  assoc_val *paVar2;
  mh_int_t *pmVar3;
  uint32_t uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  sbyte sVar8;
  uint uVar9;
  void *arg_00;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  
  ppaVar1 = h->p;
  h_00 = h->shadow;
  paVar2 = ppaVar1[x];
  uVar4 = PMurHash32(0xd,(paVar2->key).id,(paVar2->key).id_len);
  uVar7 = h_00->n_buckets;
  uVar12 = (ulong)uVar4 % (ulong)uVar7;
  uVar9 = uVar4 % (uVar7 - 1) + 1;
  pmVar3 = h_00->b;
  do {
    uVar10 = (uint)uVar12;
    uVar6 = pmVar3[uVar12 >> 4];
    if ((uVar6 >> (uVar10 & 0xf) & 1) != 0) {
      paVar2 = ppaVar1[x];
      uVar11 = (h_00->p[uVar12]->key).id_len;
      if (((paVar2->key).id_len == uVar11) &&
         (iVar5 = bcmp((paVar2->key).id,(h_00->p[uVar12]->key).id,(ulong)uVar11), uVar11 = uVar10,
         iVar5 == 0)) {
LAB_001245d8:
        arg_00 = (void *)(ulong)uVar9;
        if (uVar7 != uVar11) {
          uVar7 = uVar11 >> 4;
          sVar8 = (sbyte)(uVar11 & 0xf);
          uVar9 = 1 << sVar8;
          arg_00 = (void *)(ulong)uVar9;
          if ((pmVar3[uVar7] >> (uVar11 & 0xf) & 1) != 0) {
            uVar9 = ~uVar9;
            arg_00 = (void *)(ulong)uVar9;
            pmVar3[uVar7] = pmVar3[uVar7] & uVar9;
            h_00->size = h_00->size - 1;
            if (((pmVar3[uVar7] >> sVar8) >> 0x10 & 1) == 0) {
              h_00->n_dirty = h_00->n_dirty - 1;
            }
            if (h_00->resize_position != 0) {
              arg_00 = (void *)(ulong)uVar11;
              mh_assoc_del_resize(h_00,uVar11,arg);
            }
          }
        }
        mh_assoc_resize(h,arg_00);
        return;
      }
    }
    uVar11 = uVar7;
    if (((uVar6 >> (sbyte)(uVar10 & 0xf)) >> 0x10 & 1) == 0) goto LAB_001245d8;
    uVar10 = uVar10 + uVar9;
    uVar6 = uVar7;
    if (uVar10 < uVar7) {
      uVar6 = 0;
    }
    uVar12 = (ulong)(uVar10 - uVar6);
  } while( true );
}

Assistant:

void __attribute__((noinline))
_mh(del_resize)(struct _mh(t) *h, mh_int_t x,
		mh_arg_t arg)
{
	struct _mh(t) *s = h->shadow;
	uint32_t y = _mh(get)(s, (const mh_node_t *) &(h->p[x]),
			      arg);
	_mh(del)(s, y, arg);
	_mh(resize)(h, arg);
}